

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

void Kit_DsdPrintCofactors(uint *pTruth,int nVars,int nCofLevel,int fVerbose)

{
  uint *puVar1;
  uint *pIn;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Kit_DsdNtk_t *pKVar5;
  Kit_DsdNtk_t *pKVar6;
  int iVar7;
  long lVar8;
  uint *(*papuVar9) [16];
  ulong uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  uint **ppuVar16;
  uint **ppuVar17;
  long lVar18;
  int iVar19;
  uint *(*local_330) [16];
  int local_324;
  int piCofVar [5];
  uint *ppCofs [5] [16];
  
  if (4 < nCofLevel) {
    __assert_fail("nCofLevel < 5",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0xafb,"void Kit_DsdPrintCofactors(unsigned int *, int, int, int)");
  }
  pKVar5 = Kit_DsdDecompose(pTruth,nVars);
  pKVar6 = Kit_DsdExpand(pKVar5);
  Kit_DsdNtkFree(pKVar5);
  if (fVerbose != 0) {
    Kit_DsdPrint(_stdout,pKVar6);
    putchar(10);
  }
  Kit_DsdNtkFree(pKVar6);
  uVar14 = 0;
  iVar2 = 0x50 << ((byte)(nVars - 5U) & 0x1f);
  if (nVars < 6) {
    iVar2 = 0x50;
  }
  uVar10 = (ulong)(nVars - 5U);
  if (nVars < 6) {
    uVar10 = uVar14;
  }
  ppCofs[0][0] = (uint *)malloc((long)iVar2 << 2);
  papuVar9 = ppCofs;
  iVar2 = 0;
  for (; pIn = ppCofs[0][0], uVar14 != 5; uVar14 = uVar14 + 1) {
    for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
      (*papuVar9)[lVar13] = ppCofs[0][0] + (iVar2 + (int)lVar13 << ((byte)uVar10 & 0x1f));
    }
    papuVar9 = papuVar9 + 1;
    iVar2 = iVar2 + 0x10;
  }
  if (iVar2 != 0x50) {
    __assert_fail("nSize == 80",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0xb0c,"void Kit_DsdPrintCofactors(unsigned int *, int, int, int)");
  }
  Kit_TruthCopy(ppCofs[0][0],pTruth,nVars);
  switch(nCofLevel) {
  case 1:
    iVar2 = 0;
    if (0 < nVars) {
      iVar2 = nVars;
    }
    for (iVar19 = 0; iVar19 != iVar2; iVar19 = iVar19 + 1) {
      printf("    Variables { ");
      printf("%c ",(ulong)(iVar19 + 0x61));
      puts("}");
      Kit_TruthCofactor0New(ppCofs[1][0],pIn,nVars,iVar19);
      Kit_TruthCofactor1New(ppCofs[1][1],pIn,nVars,iVar19);
      uVar4 = 0;
      for (uVar14 = 0; uVar14 != 2; uVar14 = uVar14 + 1) {
        puVar1 = ppCofs[1][uVar14];
        pKVar5 = Kit_DsdDecompose(puVar1,nVars);
        pKVar6 = Kit_DsdExpand(pKVar5);
        Kit_DsdNtkFree(pKVar5);
        if (fVerbose != 0) {
          printf("Cof%d%d: ",1,uVar14 & 0xffffffff);
          Kit_DsdPrint(_stdout,pKVar6);
          putchar(10);
        }
        uVar3 = Kit_DsdNonDsdSizeMax(pKVar6);
        if ((int)uVar4 <= (int)uVar3) {
          uVar4 = uVar3;
        }
        Kit_DsdNtkFree(pKVar6);
        Kit_TruthSupportSize(puVar1,nVars);
      }
      printf("Max = %2d. Supps = %2d.\n",(ulong)uVar4);
    }
    goto switchD_00481567_default;
  case 2:
    local_324 = 0;
    if (0 < nVars) {
      local_324 = nVars;
    }
    iVar2 = 0;
    while (iVar19 = iVar2, iVar19 != local_324) {
      for (iVar7 = iVar19 + 1; iVar2 = iVar19 + 1, iVar7 < nVars; iVar7 = iVar7 + 1) {
        piCofVar[0] = iVar19;
        piCofVar[1] = iVar7;
        printf("    Variables { ");
        for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
          printf("%c ",(ulong)(piCofVar[lVar13] + 0x61));
        }
        puts("}");
        for (lVar13 = 1; lVar13 != 3; lVar13 = lVar13 + 1) {
          local_330 = ppCofs;
          ppuVar16 = ppCofs[1] + 1;
          lVar8 = 0;
          while (lVar8 != lVar13) {
            ppuVar17 = ppuVar16;
            for (lVar15 = 0; (uint)lVar15 >> ((byte)lVar8 & 0x1f) == 0; lVar15 = lVar15 + 1) {
              puVar1 = (*local_330)[lVar15];
              iVar2 = piCofVar[lVar8];
              Kit_TruthCofactor0New((*(uint *(*) [16])(ppuVar17 + -1))[0],puVar1,nVars,iVar2);
              Kit_TruthCofactor1New(*ppuVar17,puVar1,nVars,iVar2);
              ppuVar17 = ppuVar17 + 2;
            }
            ppuVar16 = ppuVar16 + 0x10;
            local_330 = local_330 + 1;
            lVar8 = lVar8 + 1;
          }
        }
        uVar10 = 0;
        for (uVar14 = 0; uVar14 != 4; uVar14 = uVar14 + 1) {
          puVar1 = ppCofs[2][uVar14];
          pKVar5 = Kit_DsdDecompose(puVar1,nVars);
          pKVar6 = Kit_DsdExpand(pKVar5);
          Kit_DsdNtkFree(pKVar5);
          if (fVerbose != 0) {
            printf("Cof%d%d: ",2,uVar14 & 0xffffffff);
            Kit_DsdPrint(_stdout,pKVar6);
            putchar(10);
          }
          uVar4 = Kit_DsdNonDsdSizeMax(pKVar6);
          if ((int)uVar10 <= (int)uVar4) {
            uVar10 = (ulong)uVar4;
          }
          Kit_DsdNtkFree(pKVar6);
          Kit_TruthSupportSize(puVar1,nVars);
        }
        printf("Max = %2d. Supps = %2d.\n",uVar10);
      }
    }
    if (nCofLevel != 4) {
      if (nCofLevel != 3) goto switchD_00481567_default;
      goto LAB_00481900;
    }
    break;
  case 3:
    local_324 = 0;
    if (0 < nVars) {
      local_324 = nVars;
    }
LAB_00481900:
    iVar2 = 0;
    while (iVar19 = iVar2, iVar19 != local_324) {
      iVar2 = iVar19 + 1;
      while (iVar7 = iVar2, iVar2 = iVar19 + 1, iVar7 < nVars) {
        for (iVar11 = iVar7 + 1; iVar2 = iVar7 + 1, iVar11 < nVars; iVar11 = iVar11 + 1) {
          piCofVar[0] = iVar19;
          piCofVar[1] = iVar7;
          piCofVar[2] = iVar11;
          printf("    Variables { ");
          for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
            printf("%c ",(ulong)(piCofVar[lVar13] + 0x61));
          }
          puts("}");
          for (lVar13 = 1; lVar13 != 4; lVar13 = lVar13 + 1) {
            local_330 = ppCofs;
            lVar8 = 0;
            while (lVar8 != lVar13) {
              lVar15 = 0x11;
              for (lVar18 = 0; (uint)lVar18 >> ((byte)lVar8 & 0x1f) == 0; lVar18 = lVar18 + 1) {
                puVar1 = (*local_330)[lVar18];
                iVar2 = piCofVar[lVar8];
                Kit_TruthCofactor0New(local_330[-1][lVar15 + 0xf],puVar1,nVars,iVar2);
                Kit_TruthCofactor1New((*local_330)[lVar15],puVar1,nVars,iVar2);
                lVar15 = lVar15 + 2;
              }
              local_330 = local_330 + 1;
              lVar8 = lVar8 + 1;
            }
          }
          uVar10 = 0;
          for (uVar14 = 0; uVar14 != 8; uVar14 = uVar14 + 1) {
            puVar1 = ppCofs[3][uVar14];
            pKVar5 = Kit_DsdDecompose(puVar1,nVars);
            pKVar6 = Kit_DsdExpand(pKVar5);
            Kit_DsdNtkFree(pKVar5);
            if (fVerbose != 0) {
              printf("Cof%d%d: ",3,uVar14 & 0xffffffff);
              Kit_DsdPrint(_stdout,pKVar6);
              putchar(10);
            }
            uVar4 = Kit_DsdNonDsdSizeMax(pKVar6);
            if ((int)uVar10 <= (int)uVar4) {
              uVar10 = (ulong)uVar4;
            }
            Kit_DsdNtkFree(pKVar6);
            Kit_TruthSupportSize(puVar1,nVars);
          }
          printf("Max = %2d. Supps = %2d.\n",uVar10);
        }
      }
    }
    if (nCofLevel != 4) goto switchD_00481567_default;
    break;
  case 4:
    local_324 = 0;
    if (0 < nVars) {
      local_324 = nVars;
    }
    break;
  default:
    goto switchD_00481567_default;
  }
  iVar2 = 0;
  while (iVar19 = iVar2, iVar19 != local_324) {
    iVar2 = iVar19 + 1;
    while (iVar7 = iVar2, iVar2 = iVar19 + 1, iVar7 < nVars) {
      iVar2 = iVar7 + 1;
      while (iVar11 = iVar2, iVar2 = iVar7 + 1, iVar11 < nVars) {
        for (iVar12 = iVar11 + 1; iVar2 = iVar11 + 1, iVar12 < nVars; iVar12 = iVar12 + 1) {
          piCofVar[0] = iVar19;
          piCofVar[1] = iVar7;
          piCofVar[2] = iVar11;
          piCofVar[3] = iVar12;
          printf("    Variables { ");
          for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
            printf("%c ",(ulong)(piCofVar[lVar13] + 0x61));
          }
          puts("}");
          for (lVar13 = 1; lVar13 != 5; lVar13 = lVar13 + 1) {
            local_330 = ppCofs;
            lVar8 = 0;
            while (lVar8 != lVar13) {
              lVar15 = 0x11;
              for (lVar18 = 0; (uint)lVar18 >> ((byte)lVar8 & 0x1f) == 0; lVar18 = lVar18 + 1) {
                puVar1 = (*local_330)[lVar18];
                iVar2 = piCofVar[lVar8];
                Kit_TruthCofactor0New(local_330[-1][lVar15 + 0xf],puVar1,nVars,iVar2);
                Kit_TruthCofactor1New((*local_330)[lVar15],puVar1,nVars,iVar2);
                lVar15 = lVar15 + 2;
              }
              local_330 = local_330 + 1;
              lVar8 = lVar8 + 1;
            }
          }
          uVar10 = 0;
          for (uVar14 = 0; uVar14 != 0x10; uVar14 = uVar14 + 1) {
            puVar1 = ppCofs[4][uVar14];
            pKVar5 = Kit_DsdDecompose(puVar1,nVars);
            pKVar6 = Kit_DsdExpand(pKVar5);
            Kit_DsdNtkFree(pKVar5);
            if (fVerbose != 0) {
              printf("Cof%d%d: ",4,uVar14 & 0xffffffff);
              Kit_DsdPrint(_stdout,pKVar6);
              putchar(10);
            }
            uVar4 = Kit_DsdNonDsdSizeMax(pKVar6);
            if ((int)uVar10 <= (int)uVar4) {
              uVar10 = (ulong)uVar4;
            }
            Kit_DsdNtkFree(pKVar6);
            Kit_TruthSupportSize(puVar1,nVars);
          }
          printf("Max = %2d. Supps = %2d.\n",uVar10);
        }
      }
    }
  }
switchD_00481567_default:
  free(pIn);
  return;
}

Assistant:

void Kit_DsdPrintCofactors( unsigned * pTruth, int nVars, int nCofLevel, int fVerbose )
{
    Kit_DsdNtk_t * ppNtks[32] = {0}, * pTemp;
    unsigned * ppCofs[5][16];
    int piCofVar[5];
    int nPrimeSizeMax, nPrimeSizeCur, nSuppSizeMax;
    int i, k, v1, v2, v3, v4, s, nSteps, nSize, nMemSize;
    assert( nCofLevel < 5 );

    // print the function
    ppNtks[0] = Kit_DsdDecompose( pTruth, nVars );
    ppNtks[0] = Kit_DsdExpand( pTemp = ppNtks[0] );
    Kit_DsdNtkFree( pTemp );
    if ( fVerbose )
        Kit_DsdPrint( stdout, ppNtks[0] ), printf( "\n" );
    Kit_DsdNtkFree( ppNtks[0] );

    // allocate storage for cofactors
    nMemSize = Kit_TruthWordNum(nVars);
    ppCofs[0][0] = ABC_ALLOC( unsigned, 80 * nMemSize );
    nSize = 0;
    for ( i = 0; i <  5; i++ )
    for ( k = 0; k < 16; k++ )
        ppCofs[i][k] = ppCofs[0][0] + nMemSize * nSize++;
    assert( nSize == 80 );

    // copy the function
    Kit_TruthCopy( ppCofs[0][0], pTruth, nVars );

    if ( nCofLevel == 1 )
    for ( v1 = 0; v1 < nVars; v1++ )
    {
        nSteps = 0;
        piCofVar[nSteps++] = v1;

        printf( "    Variables { " );
        for ( i = 0; i < nSteps; i++ )
            printf( "%c ", 'a' + piCofVar[i] );
        printf( "}\n" );

        // single cofactors
        for ( s = 1; s <= nSteps; s++ )
        {
            for ( k = 0; k < s; k++ )
            {
                nSize = (1 << k);
                for ( i = 0; i < nSize; i++ )
                {
                    Kit_TruthCofactor0New( ppCofs[k+1][2*i+0], ppCofs[k][i], nVars, piCofVar[k] );
                    Kit_TruthCofactor1New( ppCofs[k+1][2*i+1], ppCofs[k][i], nVars, piCofVar[k] );
                }
            }
        }
        // compute DSD networks
        nSize = (1 << nSteps);
        nPrimeSizeMax = 0;
        nSuppSizeMax = 0;
        for ( i = 0; i < nSize; i++ )
        {
            ppNtks[i] = Kit_DsdDecompose( ppCofs[nSteps][i], nVars );
            ppNtks[i] = Kit_DsdExpand( pTemp = ppNtks[i] );
            Kit_DsdNtkFree( pTemp );
            if ( fVerbose )
            {
                printf( "Cof%d%d: ", nSteps, i );
                Kit_DsdPrint( stdout, ppNtks[i] ), printf( "\n" );
            }
            // compute the largest non-decomp block
            nPrimeSizeCur  = Kit_DsdNonDsdSizeMax(ppNtks[i]);
            nPrimeSizeMax  = KIT_MAX( nPrimeSizeMax, nPrimeSizeCur );
            Kit_DsdNtkFree( ppNtks[i] );
            nSuppSizeMax += Kit_TruthSupportSize( ppCofs[nSteps][i], nVars );
        }
        printf( "Max = %2d. Supps = %2d.\n", nPrimeSizeMax, nSuppSizeMax );
    }

    if ( nCofLevel == 2 )
    for ( v1 = 0; v1 < nVars; v1++ )
    for ( v2 = v1+1; v2 < nVars; v2++ )
    {
        nSteps = 0;
        piCofVar[nSteps++] = v1;
        piCofVar[nSteps++] = v2;

        printf( "    Variables { " );
        for ( i = 0; i < nSteps; i++ )
            printf( "%c ", 'a' + piCofVar[i] );
        printf( "}\n" );

        // single cofactors
        for ( s = 1; s <= nSteps; s++ )
        {
            for ( k = 0; k < s; k++ )
            {
                nSize = (1 << k);
                for ( i = 0; i < nSize; i++ )
                {
                    Kit_TruthCofactor0New( ppCofs[k+1][2*i+0], ppCofs[k][i], nVars, piCofVar[k] );
                    Kit_TruthCofactor1New( ppCofs[k+1][2*i+1], ppCofs[k][i], nVars, piCofVar[k] );
                }
            }
        }
        // compute DSD networks
        nSize = (1 << nSteps);
        nPrimeSizeMax = 0;
        nSuppSizeMax = 0;
        for ( i = 0; i < nSize; i++ )
        {
            ppNtks[i] = Kit_DsdDecompose( ppCofs[nSteps][i], nVars );
            ppNtks[i] = Kit_DsdExpand( pTemp = ppNtks[i] );
            Kit_DsdNtkFree( pTemp );
            if ( fVerbose )
            {
                printf( "Cof%d%d: ", nSteps, i );
                Kit_DsdPrint( stdout, ppNtks[i] ), printf( "\n" );
            }
            // compute the largest non-decomp block
            nPrimeSizeCur  = Kit_DsdNonDsdSizeMax(ppNtks[i]);
            nPrimeSizeMax  = KIT_MAX( nPrimeSizeMax, nPrimeSizeCur );
            Kit_DsdNtkFree( ppNtks[i] );
            nSuppSizeMax += Kit_TruthSupportSize( ppCofs[nSteps][i], nVars );
        }
        printf( "Max = %2d. Supps = %2d.\n", nPrimeSizeMax, nSuppSizeMax );
    }

    if ( nCofLevel == 3 )
    for ( v1 = 0; v1 < nVars; v1++ )
    for ( v2 = v1+1; v2 < nVars; v2++ )
    for ( v3 = v2+1; v3 < nVars; v3++ )
    {
        nSteps = 0;
        piCofVar[nSteps++] = v1;
        piCofVar[nSteps++] = v2;
        piCofVar[nSteps++] = v3;

        printf( "    Variables { " );
        for ( i = 0; i < nSteps; i++ )
            printf( "%c ", 'a' + piCofVar[i] );
        printf( "}\n" );

        // single cofactors
        for ( s = 1; s <= nSteps; s++ )
        {
            for ( k = 0; k < s; k++ )
            {
                nSize = (1 << k);
                for ( i = 0; i < nSize; i++ )
                {
                    Kit_TruthCofactor0New( ppCofs[k+1][2*i+0], ppCofs[k][i], nVars, piCofVar[k] );
                    Kit_TruthCofactor1New( ppCofs[k+1][2*i+1], ppCofs[k][i], nVars, piCofVar[k] );
                }
            }
        }
        // compute DSD networks
        nSize = (1 << nSteps);
        nPrimeSizeMax = 0;
        nSuppSizeMax = 0;
        for ( i = 0; i < nSize; i++ )
        {
            ppNtks[i] = Kit_DsdDecompose( ppCofs[nSteps][i], nVars );
            ppNtks[i] = Kit_DsdExpand( pTemp = ppNtks[i] );
            Kit_DsdNtkFree( pTemp );
            if ( fVerbose )
            {
                printf( "Cof%d%d: ", nSteps, i );
                Kit_DsdPrint( stdout, ppNtks[i] ), printf( "\n" );
            }
            // compute the largest non-decomp block
            nPrimeSizeCur  = Kit_DsdNonDsdSizeMax(ppNtks[i]);
            nPrimeSizeMax  = KIT_MAX( nPrimeSizeMax, nPrimeSizeCur );
            Kit_DsdNtkFree( ppNtks[i] );
            nSuppSizeMax += Kit_TruthSupportSize( ppCofs[nSteps][i], nVars );
        }
        printf( "Max = %2d. Supps = %2d.\n", nPrimeSizeMax, nSuppSizeMax );
    }

    if ( nCofLevel == 4 )
    for ( v1 = 0; v1 < nVars; v1++ )
    for ( v2 = v1+1; v2 < nVars; v2++ )
    for ( v3 = v2+1; v3 < nVars; v3++ )
    for ( v4 = v3+1; v4 < nVars; v4++ )
    {
        nSteps = 0;
        piCofVar[nSteps++] = v1;
        piCofVar[nSteps++] = v2;
        piCofVar[nSteps++] = v3;
        piCofVar[nSteps++] = v4;

        printf( "    Variables { " );
        for ( i = 0; i < nSteps; i++ )
            printf( "%c ", 'a' + piCofVar[i] );
        printf( "}\n" );

        // single cofactors
        for ( s = 1; s <= nSteps; s++ )
        {
            for ( k = 0; k < s; k++ )
            {
                nSize = (1 << k);
                for ( i = 0; i < nSize; i++ )
                {
                    Kit_TruthCofactor0New( ppCofs[k+1][2*i+0], ppCofs[k][i], nVars, piCofVar[k] );
                    Kit_TruthCofactor1New( ppCofs[k+1][2*i+1], ppCofs[k][i], nVars, piCofVar[k] );
                }
            }
        }
        // compute DSD networks
        nSize = (1 << nSteps);
        nPrimeSizeMax = 0;
        nSuppSizeMax = 0;
        for ( i = 0; i < nSize; i++ )
        {
            ppNtks[i] = Kit_DsdDecompose( ppCofs[nSteps][i], nVars );
            ppNtks[i] = Kit_DsdExpand( pTemp = ppNtks[i] );
            Kit_DsdNtkFree( pTemp );
            if ( fVerbose )
            {
                printf( "Cof%d%d: ", nSteps, i );
                Kit_DsdPrint( stdout, ppNtks[i] ), printf( "\n" );
            }
            // compute the largest non-decomp block
            nPrimeSizeCur  = Kit_DsdNonDsdSizeMax(ppNtks[i]);
            nPrimeSizeMax  = KIT_MAX( nPrimeSizeMax, nPrimeSizeCur );
            Kit_DsdNtkFree( ppNtks[i] );
            nSuppSizeMax += Kit_TruthSupportSize( ppCofs[nSteps][i], nVars );
        }
        printf( "Max = %2d. Supps = %2d.\n", nPrimeSizeMax, nSuppSizeMax );
    }


    ABC_FREE( ppCofs[0][0] );
}